

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall vkt::shaderexecutor::Functions::ATan2::ATan2(ATan2 *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"atan",&local_31);
  CFloatFunc2::CFloatFunc2(&this->super_CFloatFunc2,&local_30,deAtan2);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_CFloatFunc2).super_FloatFunc2.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc2_00befe68;
  return;
}

Assistant:

ATan2			(void) : CFloatFunc2 ("atan", deAtan2) {}